

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64_adx.h
# Opt level: O0

void fiat_mulx_u64(uint64_t *out1,uint64_t *out2,uint64_t arg1,uint64_t arg2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 local_38;
  unsigned___int128 t;
  uint64_t arg2_local;
  uint64_t arg1_local;
  uint64_t *out2_local;
  uint64_t *out1_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = arg1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = arg2;
  local_38 = SUB168(auVar1 * auVar2,0);
  *out1 = local_38;
  t._0_8_ = SUB168(auVar1 * auVar2,8);
  *out2 = (uint64_t)t;
  return;
}

Assistant:

__attribute__((target("adx,bmi2")))
static inline void fiat_mulx_u64(uint64_t* out1, uint64_t* out2, uint64_t arg1, uint64_t arg2) {
// NOTE: edited after generation
#if defined(_M_X64)
  unsigned long long t;
  *out1 = _umul128(arg1, arg2, &t);
  *out2 = t;
#elif defined(_M_ARM64)
  *out1 = arg1 * arg2;
  *out2 = __umulh(arg1, arg2);
#else
  unsigned __int128 t = (unsigned __int128)arg1 * arg2;
  *out1 = t;
  *out2 = (t >> 64);
#endif
}